

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleInfoMap.h
# Opt level: O3

void __thiscall
cbtTriangleInfoMap::deSerialize(cbtTriangleInfoMap *this,cbtTriangleInfoMapData *tmapData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int *piVar4;
  cbtHashInt *ptr;
  byte bVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  cbtTriangleInfo *pcVar18;
  cbtHashInt *pcVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  cbtTriangleInfoMap *__s;
  long in_R8;
  long in_R9;
  long lVar23;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar24 [32];
  
  fVar11 = tmapData->m_planarEpsilon;
  fVar12 = tmapData->m_equalVertexThreshold;
  fVar13 = tmapData->m_edgeDistanceThreshold;
  this->m_convexEpsilon = tmapData->m_convexEpsilon;
  this->m_planarEpsilon = fVar11;
  this->m_equalVertexThreshold = fVar12;
  this->m_edgeDistanceThreshold = fVar13;
  this->m_zeroAreaThreshold = tmapData->m_zeroAreaThreshold;
  iVar3 = tmapData->m_hashTableSize;
  uVar14 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size;
  __s = this;
  iVar20 = iVar3;
  if ((int)uVar14 < iVar3) {
    lVar23 = (long)(int)uVar14;
    if ((this->super_cbtInternalTriangleInfoMap).m_hashTable.m_capacity < iVar3) {
      if (iVar3 == 0) {
        piVar17 = (int *)0x0;
      }
      else {
        piVar17 = (int *)cbtAlignedAllocInternal((long)iVar3 * 4,0x10);
        uVar14 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size;
      }
      piVar4 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
      if ((int)uVar14 < 1) {
        if (piVar4 != (int *)0x0) goto LAB_008b58cb;
      }
      else {
        uVar21 = 0;
        do {
          piVar17[uVar21] = piVar4[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
LAB_008b58cb:
        if ((this->super_cbtInternalTriangleInfoMap).m_hashTable.m_ownsMemory == true) {
          cbtAlignedFreeInternal(piVar4);
        }
      }
      (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data = piVar17;
      (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_capacity = iVar3;
    }
    else {
      piVar17 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
    }
    __s = (cbtTriangleInfoMap *)(piVar17 + lVar23);
    memset(__s,0,(iVar3 - lVar23) * 4);
    iVar20 = tmapData->m_hashTableSize;
  }
  (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_size = iVar3;
  if (0 < iVar20) {
    piVar17 = tmapData->m_hashTablePtr;
    piVar4 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
    lVar23 = 0;
    do {
      piVar4[lVar23] = piVar17[lVar23];
      lVar23 = lVar23 + 1;
    } while (lVar23 < tmapData->m_hashTableSize);
  }
  iVar3 = tmapData->m_nextSize;
  uVar14 = (this->super_cbtInternalTriangleInfoMap).m_next.m_size;
  iVar20 = iVar3;
  if ((int)uVar14 < iVar3) {
    lVar23 = (long)(int)uVar14;
    if ((this->super_cbtInternalTriangleInfoMap).m_next.m_capacity < iVar3) {
      if (iVar3 == 0) {
        piVar17 = (int *)0x0;
      }
      else {
        piVar17 = (int *)cbtAlignedAllocInternal((long)iVar3 * 4,0x10);
        uVar14 = (this->super_cbtInternalTriangleInfoMap).m_next.m_size;
      }
      piVar4 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
      if ((int)uVar14 < 1) {
        if (piVar4 != (int *)0x0) goto LAB_008b5986;
      }
      else {
        uVar21 = 0;
        do {
          piVar17[uVar21] = piVar4[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
LAB_008b5986:
        if ((this->super_cbtInternalTriangleInfoMap).m_next.m_ownsMemory == true) {
          cbtAlignedFreeInternal(piVar4);
        }
      }
      (this->super_cbtInternalTriangleInfoMap).m_next.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_next.m_data = piVar17;
      (this->super_cbtInternalTriangleInfoMap).m_next.m_capacity = iVar3;
    }
    else {
      piVar17 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
    }
    __s = (cbtTriangleInfoMap *)(piVar17 + lVar23);
    memset(__s,0,(iVar3 - lVar23) * 4);
    iVar20 = tmapData->m_nextSize;
  }
  (this->super_cbtInternalTriangleInfoMap).m_next.m_size = iVar3;
  if (0 < iVar20) {
    piVar17 = tmapData->m_nextPtr;
    piVar4 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
    lVar23 = 0;
    do {
      piVar4[lVar23] = piVar17[lVar23];
      lVar23 = lVar23 + 1;
    } while (lVar23 < tmapData->m_nextSize);
  }
  uVar14 = tmapData->m_numValues;
  uVar16 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size;
  uVar15 = uVar14;
  if ((int)uVar16 < (int)uVar14) {
    lVar23 = (long)(int)uVar16;
    if ((this->super_cbtInternalTriangleInfoMap).m_valueArray.m_capacity < (int)uVar14) {
      if (uVar14 == 0) {
        pcVar18 = (cbtTriangleInfo *)0x0;
      }
      else {
        pcVar18 = (cbtTriangleInfo *)cbtAlignedAllocInternal((long)(int)uVar14 << 4,0x10);
        uVar16 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size;
      }
      if (0 < (int)uVar16) {
        lVar22 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&((this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data)->m_flags +
                   lVar22);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pcVar18->m_flags + lVar22);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar22 = lVar22 + 0x10;
        } while ((ulong)uVar16 << 4 != lVar22);
      }
      __s = (cbtTriangleInfoMap *)(this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
      if ((__s != (cbtTriangleInfoMap *)0x0) &&
         ((this->super_cbtInternalTriangleInfoMap).m_valueArray.m_ownsMemory == true)) {
        cbtAlignedFreeInternal(__s);
      }
      (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_ownsMemory = true;
      (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data = pcVar18;
      (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_capacity = uVar14;
    }
    else {
      pcVar18 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
    }
    auVar24._8_4_ = 0x40c90fdb;
    auVar24._0_8_ = 0x40c90fdb40c90fdb;
    auVar24._12_4_ = 0x40c90fdb;
    auVar24._16_4_ = 0x40c90fdb;
    auVar24._20_4_ = 0x40c90fdb;
    auVar24._24_4_ = 0x40c90fdb;
    auVar24._28_4_ = 0x40c90fdb;
    auVar33 = vpbroadcastq_avx512f();
    auVar34 = vpaddq_avx512f(auVar33,_DAT_009ecd00);
    auVar33 = vpaddq_avx512f(auVar33,_DAT_009ecd40);
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar37 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar38 = vpbroadcastq_avx512f();
    uVar21 = 0;
    auVar39 = vpbroadcastq_avx512f();
    do {
      auVar40 = vpbroadcastq_avx512f();
      auVar41 = vpsllq_avx512f(auVar33,4);
      uVar21 = uVar21 + 0x10;
      auVar33 = vpaddq_avx512f(auVar33,auVar37);
      auVar42 = vporq_avx512f(auVar40,auVar35);
      auVar40 = vporq_avx512f(auVar40,auVar36);
      auVar43 = vpaddq_avx512f(auVar38,auVar41);
      uVar7 = vpcmpuq_avx512f(auVar42,auVar39,2);
      uVar8 = vpcmpuq_avx512f(auVar40,auVar39,2);
      auVar40 = vpsllq_avx512f(auVar34,4);
      auVar34 = vpaddq_avx512f(auVar34,auVar37);
      auVar42 = vpaddq_avx512f(auVar38,auVar40);
      vpscatterqd_avx512f(ZEXT832(pcVar18) + auVar41._0_32_,uVar7,
                          SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      vpscatterqd_avx512f(ZEXT832(pcVar18) + auVar40._0_32_,uVar8,
                          SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      vscatterqps_avx512f(ZEXT864(4) + auVar43,uVar7,auVar24);
      vscatterqps_avx512f(ZEXT864(4) + auVar42,uVar8,auVar24);
      vscatterqps_avx512f(ZEXT864(8) + auVar43,uVar7,auVar24);
      vscatterqps_avx512f(ZEXT864(8) + auVar42,uVar8,auVar24);
      vscatterqps_avx512f(ZEXT864(0xc) + auVar43,uVar7,auVar24);
      vscatterqps_avx512f(ZEXT864(0xc) + auVar42,uVar8,auVar24);
    } while ((((int)uVar14 - lVar23) + 0xfU & 0xfffffffffffffff0) != uVar21);
    uVar15 = tmapData->m_numValues;
  }
  (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_size = uVar14;
  if (0 < (int)uVar15) {
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar35 = vpbroadcastq_avx512f(ZEXT816(0x10));
    pcVar18 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
    uVar21 = (ulong)(uVar15 + 0xf & 0xfffffff0);
    auVar36 = vpbroadcastq_avx512f();
    auVar37 = vpbroadcastq_avx512f();
    auVar38 = vpbroadcastq_avx512f();
    do {
      auVar39 = vpsllq_avx512f(auVar33,4);
      uVar9 = vpcmpuq_avx512f(auVar33,auVar36,2);
      auVar40 = vpsllq_avx512f(auVar34,4);
      uVar10 = vpcmpuq_avx512f(auVar34,auVar36,2);
      auVar34 = vpaddq_avx512f(auVar34,auVar35);
      auVar33 = vpaddq_avx512f(auVar33,auVar35);
      uVar21 = uVar21 - 0x10;
      vpaddq_avx512f(auVar37,auVar39);
      vpaddq_avx512f(auVar37,auVar40);
      auVar41 = vpaddq_avx512f(auVar38,auVar40);
      auVar42 = vpaddq_avx512f(auVar38,auVar39);
      auVar24 = vgatherqps_avx512f(*(undefined8 *)(in_R9 + 4));
      bVar5 = (byte)uVar9;
      auVar25._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar24._8_8_;
      auVar25._0_8_ = (ulong)(bVar5 & 1) * auVar24._0_8_;
      auVar25._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar24._16_8_;
      auVar25._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar24._24_8_;
      auVar24 = vgatherqps_avx512f(*(undefined8 *)((long)&__s->_vptr_cbtTriangleInfoMap + 4));
      bVar6 = (byte)uVar10;
      auVar26._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar24._8_8_;
      auVar26._0_8_ = (ulong)(bVar6 & 1) * auVar24._0_8_;
      auVar26._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar24._16_8_;
      auVar26._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar24._24_8_;
      vscatterqps_avx512f(ZEXT864(4) + auVar41,uVar10,auVar26);
      vscatterqps_avx512f(ZEXT864(4) + auVar42,uVar9,auVar25);
      auVar24 = vgatherqps_avx512f(*(undefined8 *)(in_R9 + 8));
      auVar27._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar24._8_8_;
      auVar27._0_8_ = (ulong)(bVar5 & 1) * auVar24._0_8_;
      auVar27._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar24._16_8_;
      auVar27._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar24._24_8_;
      auVar24 = vgatherqps_avx512f(*(undefined8 *)
                                    &(__s->super_cbtInternalTriangleInfoMap).m_hashTable);
      auVar28._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar24._8_8_;
      auVar28._0_8_ = (ulong)(bVar6 & 1) * auVar24._0_8_;
      auVar28._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar24._16_8_;
      auVar28._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar24._24_8_;
      vscatterqps_avx512f(ZEXT864(8) + auVar41,uVar10,auVar28);
      vscatterqps_avx512f(ZEXT864(8) + auVar42,uVar9,auVar27);
      auVar24 = vgatherqps_avx512f(*(undefined8 *)(in_R9 + 0xc));
      auVar29._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar24._8_8_;
      auVar29._0_8_ = (ulong)(bVar5 & 1) * auVar24._0_8_;
      auVar29._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar24._16_8_;
      auVar29._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar24._24_8_;
      uVar7._0_4_ = (__s->super_cbtInternalTriangleInfoMap).m_hashTable.m_size;
      uVar7._4_4_ = (__s->super_cbtInternalTriangleInfoMap).m_hashTable.m_capacity;
      auVar24 = vgatherqps_avx512f(uVar7);
      auVar30._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar24._8_8_;
      auVar30._0_8_ = (ulong)(bVar6 & 1) * auVar24._0_8_;
      auVar30._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar24._16_8_;
      auVar30._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar24._24_8_;
      vscatterqps_avx512f(ZEXT864(0xc) + auVar41,uVar10,auVar30);
      vscatterqps_avx512f(ZEXT864(0xc) + auVar42,uVar9,auVar29);
      auVar24 = vpgatherqd_avx512f(*(undefined8 *)
                                    ((long)&tmapData->m_valueArrayPtr->m_flags + in_R8));
      auVar31._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar24._4_4_;
      auVar31._0_4_ = (uint)(bVar5 & 1) * auVar24._0_4_;
      auVar31._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar24._8_4_;
      auVar31._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar24._12_4_;
      auVar31._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar24._16_4_;
      auVar31._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar24._20_4_;
      auVar31._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar24._24_4_;
      auVar31._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar24._28_4_;
      auVar24 = vpgatherqd_avx512f(*(undefined8 *)
                                    ((long)tmapData->m_valueArrayPtr + ((ulong)uVar15 - 1)));
      auVar32._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar24._4_4_;
      auVar32._0_4_ = (uint)(bVar6 & 1) * auVar24._0_4_;
      auVar32._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar24._8_4_;
      auVar32._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar24._12_4_;
      auVar32._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar24._16_4_;
      auVar32._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar24._20_4_;
      auVar32._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar24._24_4_;
      auVar32._28_4_ = (uint)(byte)(uVar10 >> 7) * auVar24._28_4_;
      vpscatterqd_avx512f(ZEXT832(pcVar18) + auVar40._0_32_,uVar10,auVar32);
      vpscatterqd_avx512f(ZEXT832(pcVar18) + auVar39._0_32_,uVar9,auVar31);
    } while (uVar21 != 0);
  }
  uVar14 = tmapData->m_numKeys;
  uVar16 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size;
  uVar15 = uVar14;
  if ((int)uVar14 <= (int)uVar16) goto LAB_008b5dd8;
  lVar23 = (long)(int)uVar16;
  if ((this->super_cbtInternalTriangleInfoMap).m_keyArray.m_capacity < (int)uVar14) {
    if (uVar14 == 0) {
      pcVar19 = (cbtHashInt *)0x0;
    }
    else {
      pcVar19 = (cbtHashInt *)cbtAlignedAllocInternal((long)(int)uVar14 * 4,0x10);
      uVar16 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size;
    }
    ptr = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
    if ((int)uVar16 < 1) {
      if (ptr != (cbtHashInt *)0x0) goto LAB_008b5d9b;
    }
    else {
      uVar21 = 0;
      do {
        pcVar19[uVar21].m_uid = ptr[uVar21].m_uid;
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
LAB_008b5d9b:
      if ((this->super_cbtInternalTriangleInfoMap).m_keyArray.m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
    }
    (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_ownsMemory = true;
    (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data = pcVar19;
    (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_capacity = uVar14;
  }
  else {
    pcVar19 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
  }
  memset(pcVar19 + lVar23,0,((int)uVar14 - lVar23) * 4);
  uVar15 = tmapData->m_numKeys;
LAB_008b5dd8:
  (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_size = uVar14;
  if (0 < (int)uVar15) {
    pcVar19 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
    piVar17 = tmapData->m_keyArrayPtr;
    uVar21 = 0;
    do {
      pcVar19[uVar21].m_uid = piVar17[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar15 != uVar21);
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void cbtTriangleInfoMap::deSerialize(cbtTriangleInfoMapData& tmapData)
{
	m_convexEpsilon = tmapData.m_convexEpsilon;
	m_planarEpsilon = tmapData.m_planarEpsilon;
	m_equalVertexThreshold = tmapData.m_equalVertexThreshold;
	m_edgeDistanceThreshold = tmapData.m_edgeDistanceThreshold;
	m_zeroAreaThreshold = tmapData.m_zeroAreaThreshold;
	m_hashTable.resize(tmapData.m_hashTableSize);
	int i = 0;
	for (i = 0; i < tmapData.m_hashTableSize; i++)
	{
		m_hashTable[i] = tmapData.m_hashTablePtr[i];
	}
	m_next.resize(tmapData.m_nextSize);
	for (i = 0; i < tmapData.m_nextSize; i++)
	{
		m_next[i] = tmapData.m_nextPtr[i];
	}
	m_valueArray.resize(tmapData.m_numValues);
	for (i = 0; i < tmapData.m_numValues; i++)
	{
		m_valueArray[i].m_edgeV0V1Angle = tmapData.m_valueArrayPtr[i].m_edgeV0V1Angle;
		m_valueArray[i].m_edgeV1V2Angle = tmapData.m_valueArrayPtr[i].m_edgeV1V2Angle;
		m_valueArray[i].m_edgeV2V0Angle = tmapData.m_valueArrayPtr[i].m_edgeV2V0Angle;
		m_valueArray[i].m_flags = tmapData.m_valueArrayPtr[i].m_flags;
	}

	m_keyArray.resize(tmapData.m_numKeys, cbtHashInt(0));
	for (i = 0; i < tmapData.m_numKeys; i++)
	{
		m_keyArray[i].setUid1(tmapData.m_keyArrayPtr[i]);
	}
}